

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

ktx_error_code_e printKTX2Info2(ktxStream *stream,KTX_header2 *pHeader)

{
  uint uVar1;
  void *pvVar2;
  int *__ptr;
  long in_RSI;
  undefined8 *in_RDI;
  uint32_t numImages;
  uint32_t level;
  uint32_t layerPixelDepth;
  uint32_t layersFaces;
  ktx_uint8_t *sgd;
  ktx_uint8_t *kvd;
  ktx_uint32_t *dfd;
  ktx_error_code_e ec;
  ktx_uint32_t levelIndexSize;
  ktxLevelIndexEntry *levelIndex;
  ktx_uint32_t numLevels;
  _Bool hasSGD;
  _Bool hasKVD;
  _Bool hasDFD;
  ktx_uint32_t in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint local_70;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  undefined1 in_stack_ffffffffffffffa4;
  bool bVar6;
  undefined1 uVar7;
  bool bVar8;
  undefined1 uVar9;
  bool bVar10;
  undefined1 uVar11;
  uint local_54;
  undefined8 in_stack_ffffffffffffffc8;
  ktx_uint32_t kvdLen;
  ktx_error_code_e local_4;
  
  kvdLen = (ktx_uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  bVar10 = false;
  if (*(int *)(in_RSI + 0x30) != 0) {
    bVar10 = *(int *)(in_RSI + 0x34) != 0;
  }
  bVar8 = false;
  if (*(int *)(in_RSI + 0x38) != 0) {
    bVar8 = *(int *)(in_RSI + 0x3c) != 0;
  }
  bVar6 = false;
  if (*(long *)(in_RSI + 0x40) != 0) {
    bVar6 = *(long *)(in_RSI + 0x48) != 0;
  }
  uVar7 = bVar6;
  uVar9 = bVar8;
  uVar11 = bVar10;
  fprintf(_stdout,"Header\n\n");
  printKTX2Header((KTX_header2 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  fprintf(_stdout,"\nLevel Index\n\n");
  if (*(int *)(in_RSI + 0x28) == 0) {
    iVar5 = 1;
  }
  else {
    iVar5 = *(int *)(in_RSI + 0x28);
  }
  uVar1 = iVar5 * 0x18;
  pvVar2 = malloc((ulong)uVar1);
  if (pvVar2 == (void *)0x0) {
    local_4 = KTX_OUT_OF_MEMORY;
  }
  else {
    local_4 = (*(code *)*in_RDI)(in_RDI,pvVar2,uVar1);
    if (local_4 == KTX_SUCCESS) {
      printLevelIndex((ktxLevelIndexEntry *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff7c);
      free(pvVar2);
      if (bVar10 != false) {
        fprintf(_stdout,"\nData Format Descriptor\n\n");
        __ptr = (int *)malloc((ulong)*(uint *)(in_RSI + 0x34));
        if (__ptr == (int *)0x0) {
          return KTX_OUT_OF_MEMORY;
        }
        local_4 = (*(code *)*in_RDI)(in_RDI,__ptr,*(undefined4 *)(in_RSI + 0x34));
        if (local_4 != KTX_SUCCESS) {
          free(__ptr);
          return local_4;
        }
        if (*__ptr != *(int *)(in_RSI + 0x34)) {
          free(__ptr);
          return KTX_FILE_DATA_ERROR;
        }
        printDFD(dfd,kvd._4_4_);
        free(__ptr);
        kvdLen = (ktx_uint32_t)((ulong)__ptr >> 0x20);
      }
      if (bVar8 == false) {
        fprintf(_stdout,"\nNo Key/Value data.\n");
      }
      else {
        fprintf(_stdout,"\nKey/Value Data\n\n");
        pvVar2 = malloc((ulong)*(uint *)(in_RSI + 0x3c));
        if (pvVar2 == (void *)0x0) {
          return KTX_OUT_OF_MEMORY;
        }
        local_4 = (*(code *)*in_RDI)(in_RDI,pvVar2,*(undefined4 *)(in_RSI + 0x3c));
        if (local_4 != KTX_SUCCESS) {
          free(pvVar2);
          return local_4;
        }
        printKVData((ktx_uint8_t *)((ulong)uVar1 << 0x20),kvdLen);
        free(pvVar2);
      }
      if (bVar6 != false) {
        if (*(int *)(in_RSI + 0x2c) == 1) {
          pvVar2 = malloc(*(size_t *)(in_RSI + 0x48));
          if (pvVar2 == (void *)0x0) {
            local_4 = KTX_OUT_OF_MEMORY;
          }
          else {
            local_4 = (*(code *)in_RDI[4])(in_RDI,*(undefined8 *)(in_RSI + 0x40));
            if (local_4 == KTX_SUCCESS) {
              local_4 = (*(code *)*in_RDI)(in_RDI,pvVar2,*(undefined8 *)(in_RSI + 0x48));
              if (local_4 == KTX_SUCCESS) {
                if (*(uint *)(in_RSI + 0x20) < 2) {
                  uVar4 = 1;
                }
                else {
                  uVar4 = *(undefined4 *)(in_RSI + 0x20);
                }
                if (*(uint *)(in_RSI + 0x1c) < 2) {
                  uVar3 = 1;
                }
                else {
                  uVar3 = *(undefined4 *)(in_RSI + 0x1c);
                }
                local_54 = 1;
                while( true ) {
                  if (*(uint *)(in_RSI + 0x28) < 2) {
                    local_70 = 1;
                  }
                  else {
                    local_70 = *(uint *)(in_RSI + 0x28);
                  }
                  if (local_70 <= local_54) break;
                  local_54 = local_54 + 1;
                }
                fprintf(_stdout,"\nBasis Supercompression Global Data\n\n");
                printBasisSGDInfo((ktx_uint8_t *)
                                  CONCAT17(uVar11,CONCAT16(uVar9,CONCAT15(uVar7,CONCAT14(
                                                  in_stack_ffffffffffffffa4,iVar5)))),
                                  CONCAT44(uVar4,uVar3),local_54);
                free(pvVar2);
              }
              else {
                free(pvVar2);
              }
            }
            else {
              free(pvVar2);
            }
          }
        }
        else {
          fprintf(_stdout,"\nUnrecognized supercompressionScheme.\n");
        }
      }
    }
    else {
      free(pvVar2);
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
printKTX2Info2(ktxStream* stream, KTX_header2* pHeader)
{
    const bool hasDFD =
            pHeader->dataFormatDescriptor.byteOffset != 0 &&
            pHeader->dataFormatDescriptor.byteLength != 0;
    const bool hasKVD =
            pHeader->keyValueData.byteOffset != 0 &&
            pHeader->keyValueData.byteLength != 0;
    const bool hasSGD =
            pHeader->supercompressionGlobalData.byteOffset != 0 &&
            pHeader->supercompressionGlobalData.byteLength != 0;

    ktx_uint32_t numLevels;
    ktxLevelIndexEntry* levelIndex;
    ktx_uint32_t levelIndexSize;
    KTX_error_code ec = KTX_SUCCESS;

    fprintf(stdout, "Header\n\n");
    printKTX2Header(pHeader);

    fprintf(stdout, "\nLevel Index\n\n");
    numLevels = MAX(1, pHeader->levelCount);
    levelIndexSize = sizeof(ktxLevelIndexEntry) * numLevels;
    levelIndex = (ktxLevelIndexEntry*)malloc(levelIndexSize);
    if (levelIndex == NULL)
        return KTX_OUT_OF_MEMORY;
    ec = stream->read(stream, levelIndex, levelIndexSize);
    if (ec != KTX_SUCCESS) {
        free(levelIndex);
        return ec;
    }
    printLevelIndex(levelIndex, numLevels);
    free(levelIndex);

    if (hasDFD) {
        fprintf(stdout, "\nData Format Descriptor\n\n");
        ktx_uint32_t* dfd = (ktx_uint32_t*)malloc(pHeader->dataFormatDescriptor.byteLength);
        if (dfd == NULL)
            return KTX_OUT_OF_MEMORY;
        ec = stream->read(stream, dfd, pHeader->dataFormatDescriptor.byteLength);
        if (ec != KTX_SUCCESS) {
            free(dfd);
            return ec;
        }
        if (*dfd != pHeader->dataFormatDescriptor.byteLength) {
            free(dfd);
            return KTX_FILE_DATA_ERROR;
        }
        printDFD(dfd, pHeader->dataFormatDescriptor.byteLength);
        free(dfd);
    }

    if (hasKVD) {
        fprintf(stdout, "\nKey/Value Data\n\n");
        ktx_uint8_t* kvd = malloc(pHeader->keyValueData.byteLength);
        if (kvd == NULL)
            return KTX_OUT_OF_MEMORY;
        ec = stream->read(stream, kvd, pHeader->keyValueData.byteLength);
        if (ec != KTX_SUCCESS) {
            free(kvd);
            return ec;
        }
        printKVData(kvd, pHeader->keyValueData.byteLength);
        free(kvd);
    } else {
        fprintf(stdout, "\nNo Key/Value data.\n");
    }

    if (hasSGD) {
        if (pHeader->supercompressionScheme == KTX_SS_BASIS_LZ) {
            ktx_uint8_t* sgd = malloc(pHeader->supercompressionGlobalData.byteLength);
            if (sgd == NULL)
                return KTX_OUT_OF_MEMORY;
            ec = stream->setpos(stream, pHeader->supercompressionGlobalData.byteOffset);
            if (ec != KTX_SUCCESS) {
                free(sgd);
                return ec;
            }
            ec = stream->read(stream, sgd, pHeader->supercompressionGlobalData.byteLength);
            if (ec != KTX_SUCCESS) {
                free(sgd);
                return ec;
            }
            //
            // Calculate number of images
            //
            uint32_t layersFaces = MAX(pHeader->layerCount, 1) * pHeader->faceCount;
            uint32_t layerPixelDepth = MAX(pHeader->pixelDepth, 1);
            for(uint32_t level = 1; level < MAX(pHeader->levelCount, 1); level++)
                layerPixelDepth += MAX(MAX(pHeader->pixelDepth, 1) >> level, 1U);
            // NOTA BENE: faceCount * layerPixelDepth is only reasonable because
            // faceCount and depth can't both be > 1. I.e there are no 3d cubemaps.
            uint32_t numImages = layersFaces * layerPixelDepth;
            fprintf(stdout, "\nBasis Supercompression Global Data\n\n");
            printBasisSGDInfo(sgd, pHeader->supercompressionGlobalData.byteLength, numImages);
            free(sgd);
        } else {
            fprintf(stdout, "\nUnrecognized supercompressionScheme.\n");
        }
    }

    return ec;
}